

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTableCache::SSTableCache(SSTableCache *this,string *_fileName)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this_00;
  ulong local_2a90;
  uint64_t i;
  int offset;
  uint64_t key;
  undefined1 local_271;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  ifstream local_230 [8];
  ifstream in;
  string *_fileName_local;
  SSTableCache *this_local;
  
  SSTableHeader::SSTableHeader(&this->header);
  std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
  vector(&this->index);
  BloomFilter::BloomFilter(&this->bloomFilter);
  std::__cxx11::string::string((string *)&this->fileName,(string *)_fileName);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_230,(string *)&this->fileName,_Var2);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    SSTable::read64(local_230,(uint64_t *)this);
    SSTable::read64(local_230,&(this->header).length);
    SSTable::read64(local_230,&(this->header).minKey);
    SSTable::read64(local_230,&(this->header).maxKey);
    BloomFilter::BloomFilter((BloomFilter *)&key,local_230);
    memcpy(&this->bloomFilter,&key,0x2800);
    std::istream::seekg((long)local_230,0x2820);
    for (local_2a90 = 0; local_2a90 < (this->header).length; local_2a90 = local_2a90 + 1) {
      SSTable::read64(local_230,(uint64_t *)&stack0xffffffffffffd580);
      SSTable::read32(local_230,(int *)((long)&i + 4));
      std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
      emplace_back<unsigned_long&,int&>
                ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                  *)&this->index,(unsigned_long *)&stack0xffffffffffffd580,(int *)((long)&i + 4));
    }
    SSTable::read64(local_230,(uint64_t *)&stack0xffffffffffffd580);
    SSTable::read32(local_230,(int *)((long)&i + 4));
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long&,int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,(unsigned_long *)&stack0xffffffffffffd580,(int *)((long)&i + 4));
    std::ifstream::close();
    std::ifstream::~ifstream(local_230);
    return;
  }
  local_271 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "readHeader: Open file ");
  std::operator+(local_250,local_270);
  std::runtime_error::runtime_error(this_00,(string *)local_250);
  local_271 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableCache::SSTableCache(string _fileName) : fileName(std::move(_fileName)) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");

  SSTable::read64(in, header.timeStamp);
  SSTable::read64(in, header.length);
  SSTable::read64(in, header.minKey);
  SSTable::read64(in, header.maxKey);

  bloomFilter = BloomFilter(in);

  in.seekg(32 + 10240, ifstream::beg);

  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < header.length; i++) {
    SSTable::read64(in, key);
    SSTable::read32(in, offset);
    index.emplace_back(key, offset);
  }
  SSTable::read64(in, key);
  SSTable::read32(in, offset);
  index.emplace_back(key, offset);

  in.close();
}